

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O2

error<idx2::err_code> __thiscall idx2::StrToMetaData(idx2 *this,stref FilePath,metadata *Meta)

{
  dtype dVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  long *in_FS_OFFSET;
  stref sVar7;
  error<idx2::err_code> eVar8;
  StringTo<idx2::dtype> local_39;
  char DType [8];
  stref FilePath_local;
  
  lVar4 = FilePath._8_8_;
  FilePath_local.Size = FilePath.field_0._0_4_;
  FilePath_local.field_0 = (anon_union_8_2_2df48d06_for_stref_0)this;
  sVar7 = GetFileName(&FilePath_local);
  iVar2 = __isoc99_sscanf(sVar7.field_0.Ptr,"%[^-]-%[^-]-[%d-%d-%d]-%[^.]",lVar4,lVar4 + 0x40,
                          lVar4 + 0x80,lVar4 + 0x84,lVar4 + 0x88,DType);
  if (iVar2 == 6) {
    iVar2 = tolower((int)DType[0]);
    DType[0] = (char)iVar2;
    sVar3 = strlen(DType);
    sVar7._8_8_ = sVar3 & 0xffffffff;
    sVar7.field_0.Ptr = DType;
    dVar1 = StringTo<idx2::dtype>::operator()(&local_39,sVar7);
    *(dtype *)(lVar4 + 0x8c) = dVar1;
    uVar6 = 0x41;
    uVar5 = 0;
  }
  else {
    uVar5 = 0x11;
    uVar6 = 0x3c;
  }
  *(char **)(*in_FS_OFFSET + -0x780) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/DataSet.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x880) = uVar6;
  eVar8.Code = (int)uVar5;
  eVar8.StackIdx = (char)((ulong)uVar5 >> 0x20);
  eVar8.StrGened = (bool)(char)((ulong)uVar5 >> 0x28);
  eVar8._14_2_ = (short)((ulong)uVar5 >> 0x30);
  eVar8.Msg = "";
  return eVar8;
}

Assistant:

error<>
StrToMetaData(stref FilePath, metadata* Meta)
{
  stref FileName = GetFileName(FilePath);
  char DType[8];
  idx2_ReturnErrorIf(6 != sscanf(FileName.ConstPtr,
                                 "%[^-]-%[^-]-[%d-%d-%d]-%[^.]",
                                 Meta->Name,
                                 Meta->Field,
                                 &Meta->Dims3.X,
                                 &Meta->Dims3.Y,
                                 &Meta->Dims3.Z,
                                 DType),
                     err_code::ParseFailed);

  DType[0] = (char)tolower(DType[0]);
  Meta->DType = StringTo<dtype>()(stref(DType));

  return idx2_Error(err_code::NoError);
}